

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O3

index_t GEO::BalancedKdTree::max_node_index(index_t node_id,index_t b,index_t e)

{
  uint uVar1;
  index_t iVar2;
  index_t iVar3;
  index_t e_00;
  
  uVar1 = e - b;
  iVar3 = 0;
  if (0x10 < uVar1) {
    iVar3 = 0;
    do {
      e_00 = (uVar1 >> 1) + b;
      iVar2 = max_node_index(node_id * 2,b,e_00);
      node_id = node_id * 2 + 1;
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      uVar1 = e - e_00;
      b = e_00;
    } while (0x10 < uVar1);
  }
  if (iVar3 < node_id) {
    iVar3 = node_id;
  }
  return iVar3;
}

Assistant:

static index_t max_node_index(
            index_t node_id, index_t b, index_t e
        ) {
            if(e - b <= MAX_LEAF_SIZE) {
                return node_id;
            }
            index_t m = b + (e - b) / 2;
            return std::max(
                max_node_index(2 * node_id, b, m),
                max_node_index(2 * node_id + 1, m, e)
            );
        }